

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

Array<capnp::word> * __thiscall
capnp::_::StructReader::canonicalize(Array<capnp::word> *__return_storage_ptr__,StructReader *this)

{
  size_t sVar1;
  word *pwVar2;
  ArrayPtr<capnp::word> array;
  word *__dest;
  MessageSizeCounts MVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar4;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Array<capnp::word> backing;
  FlatMessageBuilder builder;
  DebugExpression<bool> local_131;
  Builder local_130;
  word *local_118;
  size_t sStack_110;
  undefined8 *local_108;
  FlatMessageBuilder local_f8;
  
  MVar3 = totalSize(this);
  sVar1 = MVar3.wordCount + 1;
  local_118 = (word *)kj::_::HeapArrayDisposer::allocateImpl
                                (8,sVar1,sVar1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0
                                );
  sStack_110 = MVar3.wordCount + 1;
  local_108 = &kj::_::HeapArrayDisposer::instance;
  if (sStack_110 != 0) {
    memset(local_118,0,sStack_110 * 8);
  }
  array.size_ = sStack_110;
  array.ptr = local_118;
  FlatMessageBuilder::FlatMessageBuilder(&local_f8,array);
  MessageBuilder::getRootInternal(&local_130,&local_f8.super_MessageBuilder);
  WireHelpers::zeroObject
            (local_130.builder.segment,local_130.builder.capTable,local_130.builder.pointer);
  (local_130.builder.pointer)->offsetAndKind = 0;
  (local_130.builder.pointer)->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  WireHelpers::setStructPointer
            (local_130.builder.segment,local_130.builder.capTable,local_130.builder.pointer,*this,
             (BuilderArena *)0x0,true);
  local_131.value = MessageBuilder::isCanonical(&local_f8.super_MessageBuilder);
  if (local_131.value) {
    AVar4 = MessageBuilder::getSegmentsForOutput(&local_f8.super_MessageBuilder);
    pwVar2 = (AVar4.ptr)->ptr;
    sVar1 = (AVar4.ptr)->size_;
    __dest = (word *)kj::_::HeapArrayDisposer::allocateImpl
                               (8,sVar1,sVar1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
    ;
    __return_storage_ptr__->ptr = __dest;
    __return_storage_ptr__->size_ = sVar1;
    __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    if (sVar1 != 0) {
      memcpy(__dest,pwVar2,sVar1 << 3);
    }
    FlatMessageBuilder::~FlatMessageBuilder(&local_f8);
    sVar1 = sStack_110;
    pwVar2 = local_118;
    if (local_118 != (word *)0x0) {
      local_118 = (word *)0x0;
      sStack_110 = 0;
      (**(code **)*local_108)(local_108,pwVar2,8,sVar1,sVar1,0);
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&local_130,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0xbb6,FAILED,"builder.isCanonical()","_kjCondition,",&local_131);
  kj::_::Debug::Fault::fatal((Fault *)&local_130);
}

Assistant:

kj::Array<word> StructReader::canonicalize() {
  auto size = totalSize().wordCount + POINTER_SIZE_IN_WORDS;
  kj::Array<word> backing = kj::heapArray<word>(unbound(size / WORDS));
  WireHelpers::zeroMemory(backing.asPtr());
  FlatMessageBuilder builder(backing);
  _::PointerHelpers<AnyPointer>::getInternalBuilder(builder.initRoot<AnyPointer>()).setStruct(*this, true);
  KJ_ASSERT(builder.isCanonical());
  auto output = builder.getSegmentsForOutput()[0];
  kj::Array<word> trunc = kj::heapArray<word>(output.size());
  WireHelpers::copyMemory(trunc.begin(), output);
  return trunc;
}